

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.hpp
# Opt level: O2

void __thiscall Tree::reverseQuickSort(Tree *this,int L,int R)

{
  int iVar1;
  int iVar2;
  pointer piVar3;
  pointer pvVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  int R_00;
  int iVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  int __tmp;
  long lVar13;
  int iVar14;
  int iVar15;
  
  do {
    iVar1 = (this->m_weightArray).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[(L + R) / 2];
    iVar10 = L;
    R_00 = R;
    while( true ) {
      if (R_00 < iVar10) break;
      piVar3 = (this->m_weightArray).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar7 = (long)iVar10 + -1;
      lVar6 = (long)iVar10 * 0x18 + -0x18;
      do {
        iVar14 = iVar10;
        lVar12 = lVar6;
        iVar2 = piVar3[lVar7 + 1];
        lVar7 = lVar7 + 1;
        iVar15 = iVar14 + 1;
        lVar6 = lVar12 + 0x18;
        iVar10 = iVar15;
      } while (iVar1 < iVar2);
      lVar13 = (long)R_00 + 1;
      lVar6 = (long)R_00 * 0x18 + 0x18;
      do {
        iVar8 = R_00;
        lVar11 = lVar6;
        lVar5 = lVar13 + -1;
        lVar13 = lVar13 + -1;
        iVar9 = iVar8 + -1;
        lVar6 = lVar11 + -0x18;
        R_00 = iVar9;
      } while (piVar3[lVar5] < iVar1);
      iVar10 = iVar14;
      R_00 = iVar8;
      if (lVar7 <= lVar13) {
        piVar3[lVar7] = piVar3[lVar5];
        piVar3[lVar13] = iVar2;
        pvVar4 = (this->m_vectorArray).
                 super__Vector_base<std::vector<record,_std::allocator<record>_>,_std::allocator<std::vector<record,_std::allocator<record>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        std::_Vector_base<record,_std::allocator<record>_>::_Vector_impl_data::_M_swap_data
                  ((_Vector_impl_data *)
                   ((long)&pvVar4[1].super__Vector_base<record,_std::allocator<record>_>._M_impl.
                           super__Vector_impl_data + lVar12),
                   (_Vector_impl_data *)
                   ((long)&pvVar4[-1].super__Vector_base<record,_std::allocator<record>_>._M_impl.
                           super__Vector_impl_data + lVar11));
        iVar10 = iVar15;
        R_00 = iVar9;
      }
    }
    if (L < R_00) {
      reverseQuickSort(this,L,R_00);
    }
    L = iVar10;
  } while (iVar10 < R);
  return;
}

Assistant:

void reverseQuickSort(int L, int R) {
        int i = L;
        int j = R;
        int temp = m_weightArray[(i + j) / 2];
        while (i <= j) {
            while (m_weightArray[i] > temp) {
                i++;
            }
            while (m_weightArray[j] < temp) {
                j--;
            }
            if (i <= j) {
                swap(m_weightArray[i], m_weightArray[j]);
                swap(m_vectorArray[i], m_vectorArray[j]);
                i++;
                j--;
            }
        }
        if (L < j) {
            reverseQuickSort(L, j);
        }
        if (i < R) {
            reverseQuickSort(i, R);
        }
    }